

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

char * stb_replacedir(char *output,char *src,char *dir)

{
  char buffer [4096];
  
  stb__splitpath_raw(buffer,src,6);
  if (dir == (char *)0x0) {
    strcpy(output,buffer);
  }
  else {
    sprintf(output,"%s/%s",dir,buffer);
  }
  return output;
}

Assistant:

char *stb_replacedir(char *output, char *src, char *dir)
{
   char buffer[4096];
   stb_splitpath(buffer, src, STB_FILE | STB_EXT);
   if (dir)
      sprintf(output, "%s/%s", dir, buffer);
   else
      strcpy(output, buffer);
   return output;
}